

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O0

bool __thiscall Am_Value::operator==(Am_Value *this,Am_String *test_value)

{
  Am_String_Data *this_00;
  uint uVar1;
  char *pcVar2;
  Am_String *test_value_local;
  Am_Value *this_local;
  
  uVar1 = (uint)this->type;
  if ((uVar1 - 2 < 2) || (uVar1 == 9)) {
    this_local._7_1_ = false;
    if ((this->value).wrapper_value == (Am_Wrapper *)0x0) {
      pcVar2 = Am_String::operator_cast_to_char_(test_value);
      this_local._7_1_ = pcVar2 == (char *)0x0;
    }
  }
  else if (uVar1 == 0x8008) {
    this_00 = (Am_String_Data *)(this->value).wrapper_value;
    pcVar2 = Am_String::operator_cast_to_char_(test_value);
    this_local._7_1_ = Am_String_Data::operator==(this_00,pcVar2);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Am_Value::operator==(const Am_String &test_value) const
{
  switch (type) {
  case Am_STRING:
    return *(Am_String_Data *)value.wrapper_value == test_value;
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    return !value.voidptr_value && !(const char *)test_value;
  default:
    return false;
  }
}